

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.cpp
# Opt level: O3

char * ply_get_next_comment(p_ply ply,char *last)

{
  char *pcVar1;
  
  if (last != (char *)0x0) {
    pcVar1 = (char *)0x0;
    if (last + 0x400 < ply->comment + ply->ncomments * 0x400) {
      pcVar1 = last + 0x400;
    }
    return pcVar1;
  }
  return ply->comment;
}

Assistant:

const char *ply_get_next_comment(p_ply ply, const char *last) {
    assert(ply);
    if (!last) return ply->comment;
    last += LINESIZE;
    if (last < ply->comment + LINESIZE * ply->ncomments)
        return last;
    else
        return NULL;
}